

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfInputFile.cpp
# Opt level: O1

void __thiscall Imf_3_2::InputFile::~InputFile(InputFile *this)

{
  IStream *pIVar1;
  InputStreamMutex *pIVar2;
  Data *this_00;
  
  (this->super_GenericInputFile)._vptr_GenericInputFile = (_func_int **)&PTR__InputFile_003d7988;
  if ((this->_data->_deleteStream == true) &&
     (pIVar1 = this->_data->_streamData->is, pIVar1 != (IStream *)0x0)) {
    (*pIVar1->_vptr_IStream[1])();
  }
  if ((this->_data->partNumber == -1) &&
     (pIVar2 = this->_data->_streamData, pIVar2 != (InputStreamMutex *)0x0)) {
    operator_delete(pIVar2,0x38);
  }
  this_00 = this->_data;
  if (this_00 != (Data *)0x0) {
    Data::~Data(this_00);
    operator_delete(this_00,0x108);
  }
  GenericInputFile::~GenericInputFile(&this->super_GenericInputFile);
  return;
}

Assistant:

InputFile::~InputFile ()
{
    if (_data->_deleteStream) delete _data->_streamData->is;

    // unless this file was opened via the multipart API,
    // delete the streamData object too
    if (_data->partNumber == -1 && _data->_streamData)
        delete _data->_streamData;

    if (_data) delete _data;
}